

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O2

string * __thiscall
options2f::help_abi_cxx11_(string *__return_storage_ptr__,options2f *this,char *prog)

{
  allocator local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this->valid = false;
  std::__cxx11::string::string
            ((string *)&local_38,"Free energy of ferromagnetic Ising model\n",&local_1b9);
  std::operator+(&local_1b8,&local_38,"Usage: ");
  std::operator+(&local_198,&local_1b8,prog);
  std::operator+(&local_178,&local_198," [-p prec] L T\n");
  std::operator+(&local_158,&local_178,"       ");
  std::operator+(&local_138,&local_158,prog);
  std::operator+(&local_118,&local_138," [-p prec] L J T\n");
  std::operator+(&local_f8,&local_118,"       ");
  std::operator+(&local_d8,&local_f8,prog);
  std::operator+(&local_b8,&local_d8," [-p prec] Lx Ly Jx Jy T\n");
  std::operator+(&local_98,&local_b8,"       ");
  std::operator+(&local_78,&local_98,prog);
  std::operator+(&local_58,&local_78," [-p prec] Lx Ly Jx Jy Tmin Tmax dT\n");
  std::operator+(__return_storage_ptr__,&local_58,
                 "Note: T can be specified as \"tc\" instead of real numbers\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string help(char *prog) {
    valid = false;
    return std::string("Free energy of ferromagnetic Ising model\n") +
           "Usage: " + prog + " [-p prec] L T\n" + "       " + prog +
           " [-p prec] L J T\n" + "       " + prog +
           " [-p prec] Lx Ly Jx Jy T\n" + "       " + prog +
           " [-p prec] Lx Ly Jx Jy Tmin Tmax dT\n" +
           "Note: T can be specified as \"tc\" instead of real numbers\n";
  }